

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6340f::OpenXrProgram::PollEvents
          (OpenXrProgram *this,bool *exitRenderLoop,bool *requestRestart)

{
  XrEventDataBuffer *pXVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  XrStructureType XVar3;
  XrSessionState XVar4;
  XrSessionState XVar5;
  XrAction pXVar6;
  XrSession pXVar7;
  undefined8 uVar8;
  XrSession pXVar9;
  XrResult res;
  XrEventDataBuffer *pXVar10;
  char *pcVar11;
  char *pcVar12;
  XrEventDataEventsLost *eventsLost;
  XrSessionBeginInfo sessionBeginInfo;
  string local_68;
  bool *local_48;
  bool *local_40;
  ulong local_38;
  
  *requestRestart = false;
  *exitRenderLoop = false;
  pXVar1 = &this->m_eventDataBuffer;
  paVar2 = &local_68.field_2;
  local_48 = exitRenderLoop;
  local_40 = requestRestart;
  do {
    while( true ) {
      (this->m_eventDataBuffer).type = XR_TYPE_EVENT_DATA_BUFFER;
      (this->m_eventDataBuffer).next = (void *)0x0;
      res = xrPollEvent(this->m_instance,pXVar1);
      if (res == XR_EVENT_UNAVAILABLE) {
        pXVar10 = (XrEventDataBuffer *)0x0;
      }
      else {
        if (res != XR_SUCCESS) {
          pcVar11 = "\"xrPollEvent\"";
          pcVar12 = 
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:694"
          ;
          goto LAB_0011090c;
        }
        pXVar10 = pXVar1;
        if (pXVar1->type == XR_TYPE_EVENT_DATA_EVENTS_LOST) {
          Fmt_abi_cxx11_(&local_68,"%d events lost",
                         (ulong)*(uint *)(this->m_eventDataBuffer).varying);
          Log::Write(Warning,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (pXVar10 == (XrEventDataBuffer *)0x0) {
        return;
      }
      XVar3 = pXVar10->type;
      if (XVar3 == XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED) break;
      if (XVar3 == XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED) {
        pXVar6 = (this->m_input).grabAction;
        local_68._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Grab","");
        LogActionSourceName(this,pXVar6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pXVar6 = (this->m_input).quitAction;
        local_68._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Quit","");
        LogActionSourceName(this,pXVar6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pXVar6 = (this->m_input).poseAction;
        local_68._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Pose","");
        LogActionSourceName(this,pXVar6,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != paVar2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        pXVar6 = (this->m_input).vibrateAction;
        local_68._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Vibrate","");
        LogActionSourceName(this,pXVar6,&local_68);
      }
      else {
        if (XVar3 == XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING) {
          Fmt_abi_cxx11_(&local_68,"XrEventDataInstanceLossPending by %lld",
                         *(undefined8 *)pXVar10->varying);
          Log::Write(Warning,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != paVar2) {
            operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
          }
          *local_48 = true;
          *local_40 = true;
          return;
        }
        Fmt_abi_cxx11_(&local_68,"Ignoring event type %d");
        Log::Write(Verbose,&local_68);
      }
LAB_0011082d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != paVar2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    pXVar7 = *(XrSession *)pXVar10->varying;
    XVar4 = *(XrSessionState *)(pXVar10->varying + 8);
    uVar8 = *(undefined8 *)(pXVar10->varying + 0x10);
    XVar5 = this->m_sessionState;
    this->m_sessionState = XVar4;
    pcVar12 = "XR_SESSION_STATE_UNKNOWN";
    switch(XVar5) {
    case XR_SESSION_STATE_UNKNOWN:
      break;
    case XR_SESSION_STATE_IDLE:
      pcVar12 = "XR_SESSION_STATE_IDLE";
      break;
    case XR_SESSION_STATE_READY:
      pcVar12 = "XR_SESSION_STATE_READY";
      break;
    case XR_SESSION_STATE_SYNCHRONIZED:
      pcVar12 = "XR_SESSION_STATE_SYNCHRONIZED";
      break;
    case XR_SESSION_STATE_VISIBLE:
      pcVar12 = "XR_SESSION_STATE_VISIBLE";
      break;
    case XR_SESSION_STATE_FOCUSED:
      pcVar12 = "XR_SESSION_STATE_FOCUSED";
      break;
    case XR_SESSION_STATE_STOPPING:
      pcVar12 = "XR_SESSION_STATE_STOPPING";
      break;
    case XR_SESSION_STATE_LOSS_PENDING:
      pcVar12 = "XR_SESSION_STATE_LOSS_PENDING";
      break;
    case XR_SESSION_STATE_EXITING:
      pcVar12 = "XR_SESSION_STATE_EXITING";
      break;
    default:
      if (XVar5 == XR_SESSION_STATE_MAX_ENUM) {
        pcVar12 = "XR_SESSION_STATE_MAX_ENUM";
      }
      else {
        pcVar12 = "Unknown XrSessionState";
      }
    }
    pcVar11 = "XR_SESSION_STATE_UNKNOWN";
    switch(XVar4) {
    case XR_SESSION_STATE_UNKNOWN:
      break;
    case XR_SESSION_STATE_IDLE:
      pcVar11 = "XR_SESSION_STATE_IDLE";
      break;
    case XR_SESSION_STATE_READY:
      pcVar11 = "XR_SESSION_STATE_READY";
      break;
    case XR_SESSION_STATE_SYNCHRONIZED:
      pcVar11 = "XR_SESSION_STATE_SYNCHRONIZED";
      break;
    case XR_SESSION_STATE_VISIBLE:
      pcVar11 = "XR_SESSION_STATE_VISIBLE";
      break;
    case XR_SESSION_STATE_FOCUSED:
      pcVar11 = "XR_SESSION_STATE_FOCUSED";
      break;
    case XR_SESSION_STATE_STOPPING:
      pcVar11 = "XR_SESSION_STATE_STOPPING";
      break;
    case XR_SESSION_STATE_LOSS_PENDING:
      pcVar11 = "XR_SESSION_STATE_LOSS_PENDING";
      break;
    case XR_SESSION_STATE_EXITING:
      pcVar11 = "XR_SESSION_STATE_EXITING";
      break;
    default:
      if (XVar4 == XR_SESSION_STATE_MAX_ENUM) {
        pcVar11 = "XR_SESSION_STATE_MAX_ENUM";
      }
      else {
        pcVar11 = "Unknown XrSessionState";
      }
    }
    Fmt_abi_cxx11_(&local_68,"XrEventDataSessionStateChanged: state %s->%s session=%lld time=%lld",
                   pcVar12,pcVar11,pXVar7,uVar8);
    Log::Write(Info,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pXVar9 = this->m_session;
    if (pXVar7 != pXVar9 && pXVar7 != (XrSession)0x0) {
      local_38 = 0x32;
      local_68._M_dataplus._M_p = (pointer)paVar2;
      local_68._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_68,(ulong)&local_38);
      local_68.field_2._M_allocated_capacity = local_38;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x20) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x21) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x22) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x23) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x24) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x25) = 'k';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x26) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x27) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x28) = 'w';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x29) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2a) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2b) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2c) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2d) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2e) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x2f) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x11) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x12) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x13) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x14) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x15) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x16) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x17) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x18) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x19) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1a) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1b) = 'g';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1c) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1d) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1e) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x1f) = 'f';
      *(undefined8 *)local_68._M_dataplus._M_p = 0x44746e6576457258;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 8) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 9) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 10) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0xb) = 'S';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0xc) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0xd) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0xe) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x30) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p + 0x31) = 'n';
      local_68._M_string_length = local_38;
      local_68._M_dataplus._M_p[local_38] = '\0';
      Log::Write(Error,&local_68);
      goto LAB_0011082d;
    }
    switch(this->m_sessionState) {
    case XR_SESSION_STATE_READY:
      if (pXVar9 == (XrSession)0x0) {
        local_68.field_2._M_allocated_capacity = 0x6166206b63656843;
        local_68.field_2._8_4_ = 0x64656c69;
        local_68._M_string_length = 0xc;
        local_68.field_2._M_local_buf[0xc] = '\0';
        local_68._M_dataplus._M_p = (pointer)paVar2;
        Throw(&local_68,"m_session != XR_NULL_HANDLE",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:745"
             );
      }
      local_68._M_dataplus._M_p = (pointer)0xa;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity._4_4_ = 0;
      local_68.field_2._M_allocated_capacity._0_4_ =
           (((this->m_options).super___shared_ptr<const_Options,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->Parsed).ViewConfigType;
      res = xrBeginSession(pXVar9,&local_68);
      if (res < XR_SUCCESS) {
        pcVar11 = "xrBeginSession(m_session, &sessionBeginInfo)";
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:748"
        ;
        goto LAB_0011090c;
      }
      this->m_sessionRunning = true;
      break;
    case XR_SESSION_STATE_STOPPING:
      if (pXVar9 == (XrSession)0x0) {
        local_68.field_2._M_allocated_capacity = 0x6166206b63656843;
        local_68.field_2._8_4_ = 0x64656c69;
        local_68._M_string_length = 0xc;
        local_68.field_2._M_local_buf[0xc] = '\0';
        local_68._M_dataplus._M_p = (pointer)paVar2;
        Throw(&local_68,"m_session != XR_NULL_HANDLE",
              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:753"
             );
      }
      this->m_sessionRunning = false;
      res = xrEndSession();
      if (res < XR_SUCCESS) {
        pcVar11 = "xrEndSession(m_session)";
        pcVar12 = 
        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:755"
        ;
LAB_0011090c:
        ThrowXrResult(res,pcVar11,pcVar12);
      }
      break;
    case XR_SESSION_STATE_LOSS_PENDING:
      *local_48 = true;
      *local_40 = true;
      break;
    case XR_SESSION_STATE_EXITING:
      *local_48 = true;
      *local_40 = false;
    }
  } while( true );
}

Assistant:

void PollEvents(bool* exitRenderLoop, bool* requestRestart) override {
        *exitRenderLoop = *requestRestart = false;

        // Process all pending messages.
        while (const XrEventDataBaseHeader* event = TryReadNextEvent()) {
            switch (event->type) {
                case XR_TYPE_EVENT_DATA_INSTANCE_LOSS_PENDING: {
                    const auto& instanceLossPending = *reinterpret_cast<const XrEventDataInstanceLossPending*>(event);
                    Log::Write(Log::Level::Warning, Fmt("XrEventDataInstanceLossPending by %lld", instanceLossPending.lossTime));
                    *exitRenderLoop = true;
                    *requestRestart = true;
                    return;
                }
                case XR_TYPE_EVENT_DATA_SESSION_STATE_CHANGED: {
                    auto sessionStateChangedEvent = *reinterpret_cast<const XrEventDataSessionStateChanged*>(event);
                    HandleSessionStateChangedEvent(sessionStateChangedEvent, exitRenderLoop, requestRestart);
                    break;
                }
                case XR_TYPE_EVENT_DATA_INTERACTION_PROFILE_CHANGED:
                    LogActionSourceName(m_input.grabAction, "Grab");
                    LogActionSourceName(m_input.quitAction, "Quit");
                    LogActionSourceName(m_input.poseAction, "Pose");
                    LogActionSourceName(m_input.vibrateAction, "Vibrate");
                    break;
                case XR_TYPE_EVENT_DATA_REFERENCE_SPACE_CHANGE_PENDING:
                default: {
                    Log::Write(Log::Level::Verbose, Fmt("Ignoring event type %d", event->type));
                    break;
                }
            }
        }
    }